

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

JSONArray * __thiscall JSON::JSONValue::getArrayValue(JSONValue *this)

{
  ostream *poVar1;
  string sStack_38;
  
  if (this->type != ARRAY) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Error requesting JSON array value from ");
    getTypeAsString_abi_cxx11_(&sStack_38,this);
    poVar1 = std::operator<<(poVar1,(string *)&sStack_38);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&sStack_38);
  }
  return (JSONArray *)this->data;
}

Assistant:

const JSONArray &JSONValue::getArrayValue() const {
#ifdef JSON_TYPE_ERRORS_ON
	if(getType()!=ARRAY)
	cerr << "Error requesting JSON array value from " << getTypeAsString() << endl;
#endif

	return *((JSONArray*)data);
}